

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O2

void qclab::printMatrix2x2<qclab::dense::SquareMatrix<double>>(SquareMatrix<double> *mat)

{
  if (mat->size_ == 2) {
    print<double>(*(mat->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                   _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                   super__Head_base<0UL,_double_*,_false>._M_head_impl);
    print<double>((mat->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                  _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl[mat->size_]);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    print<double>((mat->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                  _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl[1]);
    print<double>((mat->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                  _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl[mat->size_ + 1]);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    return;
  }
  __assert_fail("mat.rows() == 2",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/util.hpp"
                ,0x61,
                "void qclab::printMatrix2x2(const T &) [T = qclab::dense::SquareMatrix<double>]");
}

Assistant:

void printMatrix2x2( const T& mat ) {
    assert( mat.rows() == 2 ) ;
    assert( mat.cols() == 2 ) ;
    print( mat(0,0) ) ; print( mat(0,1) ) ; std::cout << std::endl ;
    print( mat(1,0) ) ; print( mat(1,1) ) ; std::cout << std::endl ;
  }